

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_fxsub(sexp ctx,sexp a,sexp_uint_t b)

{
  long lVar1;
  sexp *ppsVar2;
  sexp_uint_t sVar3;
  bool bVar4;
  
  sVar3 = (a->value).string.offset;
  ppsVar2 = &(a->value).type.slots;
  do {
    if (sVar3 == 1) {
      if (*ppsVar2 <= b && (sexp)(b - (long)*ppsVar2) != (sexp)0x0) {
        (a->value).type.slots = (sexp)(b - (long)*ppsVar2);
        (a->value).flonum_bits[0] = -(a->value).flonum_bits[0];
        return a;
      }
      break;
    }
    lVar1 = sVar3 * 8;
    sVar3 = sVar3 - 1;
  } while (*(long *)((long)&a->value + lVar1 + 8) == 0);
  if (b != 0) {
    do {
      bVar4 = *ppsVar2 < b;
      *ppsVar2 = (sexp)((long)*ppsVar2 - b);
      ppsVar2 = ppsVar2 + 1;
      b = 1;
    } while (bVar4);
  }
  return a;
}

Assistant:

sexp sexp_bignum_fxsub (sexp ctx, sexp a, sexp_uint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), borrow, i=0, n;
  if ((len == 1) && (b > data[0])) {
    data[0] = b - data[0];
    sexp_bignum_sign(a) = -sexp_bignum_sign(a);
  } else {
    for (borrow=b; borrow; i++) {
      n = data[i];
      data[i] -= borrow;
      borrow = (n < borrow);
    }
  }
  return a;
}